

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseLabelOpt(WastParser *this,string *out_label)

{
  bool bVar1;
  Token local_90;
  string_view local_50;
  string local_40;
  string *local_20;
  string *out_label_local;
  WastParser *this_local;
  
  local_20 = out_label;
  out_label_local = (string *)this;
  bVar1 = PeekMatch(this,Last_String);
  if (bVar1) {
    Consume(&local_90,this);
    local_50 = Token::text(&local_90);
    string_view::to_string_abi_cxx11_(&local_40,&local_50);
    std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::clear();
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseLabelOpt(std::string* out_label) {
  WABT_TRACE(ParseLabelOpt);
  if (PeekMatch(TokenType::Var)) {
    *out_label = Consume().text().to_string();
  } else {
    out_label->clear();
  }
  return Result::Ok;
}